

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  long lVar2;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  initializer_list<std::pair<BigNum,_BigNum>_> __l;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_00;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_01;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_02;
  BigNum b;
  BigNum c;
  BigNum a;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test2;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test4;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test;
  long alStack_a80 [7];
  allocator_type local_a41;
  pair<BigNum,_BigNum> local_a40;
  pair<BigNum,_BigNum> local_a00;
  pair<BigNum,_BigNum> local_9c0;
  BigNum local_980;
  BigNum local_960;
  BigNum local_940;
  BigNum local_920;
  BigNum local_900;
  BigNum local_8e0;
  BigNum local_8c0;
  BigNum local_8a0;
  BigNum local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_6c0;
  BigNum local_6a8;
  BigNum local_688;
  BigNum local_668;
  BigNum local_648;
  BigNum local_628;
  BigNum local_608;
  BigNum local_5e8;
  BigNum local_5c8;
  BigNum local_5a8;
  BigNum local_588;
  BigNum local_568;
  BigNum local_548;
  BigNum local_528;
  BigNum local_508;
  BigNum local_4e8;
  BigNum local_4c8;
  BigNum local_4a8;
  BigNum local_488;
  BigNum local_468;
  BigNum local_448;
  BigNum local_428;
  BigNum local_408;
  BigNum local_3e8;
  BigNum local_3c8;
  BigNum local_3a8;
  BigNum local_388;
  BigNum local_368;
  BigNum local_348;
  BigNum local_328;
  BigNum local_308;
  BigNum local_2e8;
  BigNum local_2c8;
  BigNum local_2a8;
  BigNum local_288;
  BigNum local_268;
  BigNum local_248;
  BigNum local_228;
  BigNum local_208;
  BigNum local_1e8;
  BigNum local_1c8;
  BigNum local_1a8;
  BigNum local_188;
  BigNum local_168;
  BigNum local_148;
  BigNum local_128;
  BigNum local_108;
  BigNum local_e8;
  string local_c8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_a8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_90;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_78;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_60;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_48;
  
  alStack_a80[6] = 0x108b37;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"6","");
  alStack_a80[6] = 0x108b47;
  BigNum::BigNum(&local_940,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    alStack_a80[6] = 0x108b64;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108b8b;
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"2","");
  alStack_a80[6] = 0x108ba0;
  BigNum::BigNum(&local_980,&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    alStack_a80[6] = 0x108bbd;
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108be4;
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"1234567827483828383893828238989938389893389","");
  alStack_a80[6] = 0x108bf9;
  BigNum::BigNum(&local_960,&local_700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    alStack_a80[6] = 0x108c16;
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108c3d;
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"123456798960569059","");
  alStack_a80[6] = 0x108c4f;
  BigNum::BigNum(&local_a40.first,&local_720);
  alStack_a80[6] = 0x108c61;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108c8e;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    alStack_a80[6] = 0x108cab;
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108cc0;
  BigNum::BigNum(&local_e8,&local_980);
  alStack_a80[6] = 0x108cd2;
  sqrt(__x);
  alStack_a80[6] = 0x108ce7;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108d14;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108d31;
    operator_delete(local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108d49;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sqrt ",6);
  alStack_a80[6] = 0x108d5e;
  BigNum::BigNum(&local_108,&local_980);
  alStack_a80[6] = 0x108d6b;
  print(&local_108);
  if (local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108d88;
    operator_delete(local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108da3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x108db8;
  BigNum::BigNum(&local_128,&local_960);
  alStack_a80[6] = 0x108dc5;
  print(&local_128);
  if (local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108de2;
    operator_delete(local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108df6;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x108e05;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x108e0d;
  std::ostream::flush();
  alStack_a80[6] = 0x108e1f;
  BigNum::BigNum(&local_8c0,2);
  alStack_a80[6] = 0x108e31;
  BigNum::BigNum(&local_8e0,5);
  alStack_a80[6] = 0x108e4e;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x108e65;
  BigNum::BigNum(&local_900,3);
  alStack_a80[6] = 0x108e77;
  BigNum::BigNum(&local_920,7);
  alStack_a80[6] = 0x108e8f;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x108ea9;
  BigNum::BigNum(&local_880,5);
  alStack_a80[6] = 0x108ebb;
  BigNum::BigNum(&local_8a0,0xb);
  alStack_a80[6] = 0x108ed3;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_9c0,&local_880,&local_8a0);
  alStack_a80[6] = 0x108ef2;
  __l._M_len = 3;
  __l._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_48,__l,(allocator_type *)&local_6c0);
  lVar2 = 0xc0;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x108f1e;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x108f35;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108f58;
    operator_delete(local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108f75;
    operator_delete(local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108f92;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108faf;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108fcc;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108fe9;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108ffe;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_60,&local_48);
  alStack_a80[6] = 0x109010;
  solve_system(&local_a40.first,&local_60);
  alStack_a80[6] = 0x109025;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10904b;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109058;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_60);
  alStack_a80[6] = 0x109073;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x109088;
  BigNum::BigNum(&local_148,&local_960);
  alStack_a80[6] = 0x109095;
  print(&local_148);
  if (local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1090b2;
    operator_delete(local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1090c6;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x1090d5;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x1090dd;
  std::ostream::flush();
  alStack_a80[6] = 0x1090ef;
  BigNum::BigNum(&local_8c0,5);
  alStack_a80[6] = 0x109101;
  BigNum::BigNum(&local_8e0,9);
  alStack_a80[6] = 0x10911e;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x109135;
  BigNum::BigNum(&local_900,7);
  alStack_a80[6] = 0x109147;
  BigNum::BigNum(&local_920,8);
  alStack_a80[6] = 0x10915f;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x109179;
  BigNum::BigNum(&local_880,3);
  alStack_a80[6] = 0x10918b;
  BigNum::BigNum(&local_8a0,7);
  alStack_a80[6] = 0x1091a3;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_9c0,&local_880,&local_8a0);
  alStack_a80[6] = 0x1091bf;
  __l_00._M_len = 3;
  __l_00._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_6c0,__l_00,&local_a41);
  lVar2 = 0xc0;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x1091db;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x1091f2;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109215;
    operator_delete(local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109232;
    operator_delete(local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10924f;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10926c;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109289;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1092a6;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1092bb;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_78,&local_6c0);
  alStack_a80[6] = 0x1092cd;
  solve_system(&local_a40.first,&local_78);
  alStack_a80[6] = 0x1092e2;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109308;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109315;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_78);
  alStack_a80[6] = 0x109330;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x109345;
  BigNum::BigNum(&local_168,&local_960);
  alStack_a80[6] = 0x109352;
  print(&local_168);
  if (local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10936f;
    operator_delete(local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109383;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109392;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10939a;
  std::ostream::flush();
  alStack_a80[6] = 0x1093ac;
  BigNum::BigNum(&local_8c0,1);
  alStack_a80[6] = 0x1093be;
  BigNum::BigNum(&local_8e0,5);
  alStack_a80[6] = 0x1093db;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x1093f2;
  BigNum::BigNum(&local_900,2);
  alStack_a80[6] = 0x109404;
  BigNum::BigNum(&local_920,7);
  alStack_a80[6] = 0x10941c;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x10943b;
  __l_01._M_len = 2;
  __l_01._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880,__l_01,(allocator_type *)&local_8a0);
  lVar2 = 0x80;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x109457;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x10946e;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109491;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1094ae;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1094cb;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1094e8;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1094fd;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_90,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880);
  alStack_a80[6] = 0x10950f;
  solve_system(&local_a40.first,&local_90);
  alStack_a80[6] = 0x109524;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10954a;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109557;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_90);
  alStack_a80[6] = 0x109572;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x109587;
  BigNum::BigNum(&local_188,&local_960);
  alStack_a80[6] = 0x109594;
  print(&local_188);
  if (local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1095b1;
    operator_delete(local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1095c5;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x1095d4;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x1095dc;
  std::ostream::flush();
  alStack_a80[6] = 0x1095eb;
  BigNum::BigNum(&local_8c0,0);
  alStack_a80[6] = 0x1095fd;
  BigNum::BigNum(&local_8e0,2);
  alStack_a80[6] = 0x10961a;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x10962e;
  BigNum::BigNum(&local_900,0);
  alStack_a80[6] = 0x109640;
  BigNum::BigNum(&local_920,4);
  alStack_a80[6] = 0x109658;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x109674;
  __l_02._M_len = 2;
  __l_02._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0,__l_02,&local_a41);
  lVar2 = 0x80;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x109690;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x1096a7;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1096ca;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1096e7;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109704;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109721;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109736;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_a8,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0);
  alStack_a80[6] = 0x109748;
  solve_system(&local_a40.first,&local_a8);
  alStack_a80[6] = 0x10975a;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109780;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10978d;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_a8);
  alStack_a80[6] = 0x1097a8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x1097bd;
  BigNum::BigNum(&local_1a8,&local_960);
  alStack_a80[6] = 0x1097ca;
  print(&local_1a8);
  if (local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1097e7;
    operator_delete(local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1097fb;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10980a;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109812;
  std::ostream::flush();
  alStack_a80[6] = 0x109821;
  BigNum::BigNum(&local_a40.first,5);
  alStack_a80[6] = 0x109833;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109860;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10986f;
  BigNum::BigNum(&local_a40.first,0xd);
  alStack_a80[6] = 0x109881;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1098a9;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1098be;
  BigNum::BigNum(&local_1c8,&local_940);
  alStack_a80[6] = 0x1098d3;
  BigNum::BigNum(&local_1e8,&local_980);
  alStack_a80[6] = 0x1098ed;
  reverseByMod(&local_a40.first,&local_1c8,&local_1e8);
  alStack_a80[6] = 0x1098ff;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109925;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109942;
    operator_delete(local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10995f;
    operator_delete(local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109974;
  BigNum::BigNum(&local_208,&local_940);
  alStack_a80[6] = 0x109981;
  print(&local_208);
  if (local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10999e;
    operator_delete(local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1099b6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x1099cb;
  BigNum::BigNum(&local_228,&local_980);
  alStack_a80[6] = 0x1099d8;
  print(&local_228);
  if (local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1099f5;
    operator_delete(local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109a10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109a25;
  BigNum::BigNum(&local_248,&local_960);
  alStack_a80[6] = 0x109a32;
  print(&local_248);
  if (local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109a4f;
    operator_delete(local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109a63;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109a72;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109a7a;
  std::ostream::flush();
  alStack_a80[6] = 0x109a89;
  BigNum::BigNum(&local_a40.first,5);
  alStack_a80[6] = 0x109a9b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109ac9;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ad8;
  BigNum::BigNum(&local_a40.first,7);
  alStack_a80[6] = 0x109aea;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109b12;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109b27;
  BigNum::BigNum(&local_268,&local_940);
  alStack_a80[6] = 0x109b3c;
  BigNum::BigNum(&local_288,&local_980);
  alStack_a80[6] = 0x109b56;
  reverseByMod(&local_a40.first,&local_268,&local_288);
  alStack_a80[6] = 0x109b68;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109b8e;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109bab;
    operator_delete(local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109bc8;
    operator_delete(local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109bdd;
  BigNum::BigNum(&local_2a8,&local_940);
  alStack_a80[6] = 0x109bea;
  print(&local_2a8);
  if (local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c07;
    operator_delete(local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109c1f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x109c34;
  BigNum::BigNum(&local_2c8,&local_980);
  alStack_a80[6] = 0x109c41;
  print(&local_2c8);
  if (local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c5e;
    operator_delete(local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109c79;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109c8e;
  BigNum::BigNum(&local_2e8,&local_960);
  alStack_a80[6] = 0x109c9b;
  print(&local_2e8);
  if (local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109cb8;
    operator_delete(local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ccc;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109cdb;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109ce3;
  std::ostream::flush();
  alStack_a80[6] = 0x109cf2;
  BigNum::BigNum(&local_a40.first,0x47);
  alStack_a80[6] = 0x109d04;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109d2a;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109d39;
  BigNum::BigNum(&local_a40.first,0x5b);
  alStack_a80[6] = 0x109d4b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109d73;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109d88;
  BigNum::BigNum(&local_308,&local_940);
  alStack_a80[6] = 0x109d9d;
  BigNum::BigNum(&local_328,&local_980);
  alStack_a80[6] = 0x109db7;
  reverseByMod(&local_a40.first,&local_308,&local_328);
  alStack_a80[6] = 0x109dc9;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109def;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109e0c;
    operator_delete(local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109e29;
    operator_delete(local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109e3e;
  BigNum::BigNum(&local_348,&local_940);
  alStack_a80[6] = 0x109e4b;
  print(&local_348);
  if (local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109e68;
    operator_delete(local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109e80;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x109e95;
  BigNum::BigNum(&local_368,&local_980);
  alStack_a80[6] = 0x109ea2;
  print(&local_368);
  if (local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109ebf;
    operator_delete(local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109eda;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109eef;
  BigNum::BigNum(&local_388,&local_960);
  alStack_a80[6] = 0x109efc;
  print(&local_388);
  if (local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109f19;
    operator_delete(local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109f2d;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109f3c;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109f44;
  std::ostream::flush();
  alStack_a80[6] = 0x109f6b;
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"12","");
  alStack_a80[6] = 0x109f7d;
  BigNum::BigNum(&local_a40.first,&local_740);
  alStack_a80[6] = 0x109f8f;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109fb5;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    alStack_a80[6] = 0x109fd2;
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x109ff9;
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"6","");
  alStack_a80[6] = 0x10a00b;
  BigNum::BigNum(&local_a40.first,&local_760);
  alStack_a80[6] = 0x10a01d;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a045;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    alStack_a80[6] = 0x10a062;
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a077;
  BigNum::BigNum(&local_3a8,&local_940);
  alStack_a80[6] = 0x10a08c;
  BigNum::BigNum(&local_3c8,&local_980);
  alStack_a80[6] = 0x10a0a6;
  operator/(&local_a40.first,&local_3a8,&local_3c8);
  alStack_a80[6] = 0x10a0b8;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a0de;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a0fb;
    operator_delete(local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a118;
    operator_delete(local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a12d;
  BigNum::BigNum(&local_3e8,&local_940);
  alStack_a80[6] = 0x10a13a;
  print(&local_3e8);
  if (local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a157;
    operator_delete(local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a16f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
  alStack_a80[6] = 0x10a184;
  BigNum::BigNum(&local_408,&local_980);
  alStack_a80[6] = 0x10a191;
  print(&local_408);
  if (local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a1ae;
    operator_delete(local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a1c9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a1de;
  BigNum::BigNum(&local_428,&local_960);
  alStack_a80[6] = 0x10a1eb;
  print(&local_428);
  if (local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a208;
    operator_delete(local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a21c;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a22b;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a233;
  std::ostream::flush();
  alStack_a80[6] = 0x10a25a;
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"3","");
  alStack_a80[6] = 0x10a26c;
  BigNum::BigNum(&local_a40.first,&local_780);
  alStack_a80[6] = 0x10a27e;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a2a4;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    alStack_a80[6] = 0x10a2c1;
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a2e8;
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"9","");
  alStack_a80[6] = 0x10a2fa;
  BigNum::BigNum(&local_a40.first,&local_7a0);
  alStack_a80[6] = 0x10a30c;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a334;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    alStack_a80[6] = 0x10a351;
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a366;
  BigNum::BigNum(&local_448,&local_940);
  alStack_a80[6] = 0x10a37b;
  BigNum::BigNum(&local_468,&local_980);
  alStack_a80[6] = 0x10a395;
  pow(__x_00,in_XMM1_Qa);
  alStack_a80[6] = 0x10a3a7;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a3cd;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a3ea;
    operator_delete(local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a407;
    operator_delete(local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a41c;
  BigNum::BigNum(&local_488,&local_940);
  alStack_a80[6] = 0x10a429;
  print(&local_488);
  if (local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a446;
    operator_delete(local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a45e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^",1);
  alStack_a80[6] = 0x10a473;
  BigNum::BigNum(&local_4a8,&local_980);
  alStack_a80[6] = 0x10a480;
  print(&local_4a8);
  if (local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a49d;
    operator_delete(local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a4b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a4cd;
  BigNum::BigNum(&local_4c8,&local_960);
  alStack_a80[6] = 0x10a4da;
  print(&local_4c8);
  if (local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a4f7;
    operator_delete(local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a50b;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a51a;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a522;
  std::ostream::flush();
  alStack_a80[6] = 0x10a549;
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"400","");
  alStack_a80[6] = 0x10a55b;
  BigNum::BigNum(&local_a40.first,&local_7c0);
  alStack_a80[6] = 0x10a56d;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a593;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    alStack_a80[6] = 0x10a5b0;
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a5d7;
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"9","");
  alStack_a80[6] = 0x10a5e9;
  BigNum::BigNum(&local_a40.first,&local_7e0);
  alStack_a80[6] = 0x10a5fb;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a623;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    alStack_a80[6] = 0x10a640;
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a655;
  BigNum::BigNum(&local_4e8,&local_940);
  alStack_a80[6] = 0x10a66a;
  BigNum::BigNum(&local_508,&local_980);
  alStack_a80[6] = 0x10a684;
  operator+(&local_a40.first,&local_4e8,&local_508);
  alStack_a80[6] = 0x10a696;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a6bc;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a6d9;
    operator_delete(local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a6f6;
    operator_delete(local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a70b;
  BigNum::BigNum(&local_528,&local_940);
  alStack_a80[6] = 0x10a718;
  print(&local_528);
  if (local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a735;
    operator_delete(local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a74d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + ",3);
  alStack_a80[6] = 0x10a762;
  BigNum::BigNum(&local_548,&local_980);
  alStack_a80[6] = 0x10a76f;
  print(&local_548);
  if (local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a78c;
    operator_delete(local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a7a7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a7bc;
  BigNum::BigNum(&local_568,&local_960);
  alStack_a80[6] = 0x10a7c9;
  print(&local_568);
  if (local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a7e6;
    operator_delete(local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a7fa;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a809;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a811;
  std::ostream::flush();
  alStack_a80[6] = 0x10a838;
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"64","");
  alStack_a80[6] = 0x10a84a;
  BigNum::BigNum(&local_a40.first,&local_800);
  alStack_a80[6] = 0x10a85c;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a882;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    alStack_a80[6] = 0x10a89f;
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a8c6;
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"64","");
  alStack_a80[6] = 0x10a8d8;
  BigNum::BigNum(&local_a40.first,&local_820);
  alStack_a80[6] = 0x10a8ea;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a912;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    alStack_a80[6] = 0x10a92f;
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a944;
  BigNum::BigNum(&local_588,&local_940);
  alStack_a80[6] = 0x10a959;
  BigNum::BigNum(&local_5a8,&local_980);
  alStack_a80[6] = 0x10a973;
  operator*(&local_a40.first,&local_588,&local_5a8);
  alStack_a80[6] = 0x10a985;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a9ab;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a9c8;
    operator_delete(local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a9e5;
    operator_delete(local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a9fa;
  BigNum::BigNum(&local_5c8,&local_940);
  alStack_a80[6] = 0x10aa07;
  print(&local_5c8);
  if (local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aa24;
    operator_delete(local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10aa3c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," * ",3);
  alStack_a80[6] = 0x10aa51;
  BigNum::BigNum(&local_5e8,&local_980);
  alStack_a80[6] = 0x10aa5e;
  print(&local_5e8);
  if (local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aa7b;
    operator_delete(local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10aa96;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10aaab;
  BigNum::BigNum(&local_608,&local_960);
  alStack_a80[6] = 0x10aab8;
  print(&local_608);
  if (local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aad5;
    operator_delete(local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10aae9;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10aaf8;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10ab00;
  std::ostream::flush();
  alStack_a80[6] = 0x10ab27;
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"4096","");
  alStack_a80[6] = 0x10ab39;
  BigNum::BigNum(&local_a40.first,&local_840);
  alStack_a80[6] = 0x10ab4b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ab71;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    alStack_a80[6] = 0x10ab8e;
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10abb5;
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"4","");
  alStack_a80[6] = 0x10abc7;
  BigNum::BigNum(&local_a40.first,&local_860);
  alStack_a80[6] = 0x10abd9;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ac01;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    alStack_a80[6] = 0x10ac1e;
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10ac33;
  BigNum::BigNum(&local_628,&local_940);
  alStack_a80[6] = 0x10ac48;
  BigNum::BigNum(&local_648,&local_980);
  alStack_a80[6] = 0x10ac62;
  operator/(&local_a40.first,&local_628,&local_648);
  alStack_a80[6] = 0x10ac74;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ac9a;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10acb7;
    operator_delete(local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10acd4;
    operator_delete(local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ace9;
  BigNum::BigNum(&local_668,&local_940);
  alStack_a80[6] = 0x10acf6;
  print(&local_668);
  if (local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad13;
    operator_delete(local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ad2b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
  alStack_a80[6] = 0x10ad40;
  BigNum::BigNum(&local_688,&local_980);
  alStack_a80[6] = 0x10ad4d;
  print(&local_688);
  if (local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad6a;
    operator_delete(local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ad85;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10ad9a;
  BigNum::BigNum(&local_6a8,&local_960);
  alStack_a80[6] = 0x10ada7;
  print(&local_6a8);
  if (local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10adc4;
    operator_delete(local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10add8;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10ade7;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10adef;
  std::ostream::flush();
  alStack_a80[6] = 0x10adfc;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0);
  alStack_a80[6] = 0x10ae09;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880);
  alStack_a80[6] = 0x10ae16;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_6c0);
  alStack_a80[6] = 0x10ae23;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_48);
  if (local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ae40;
    operator_delete(local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ae5d;
    operator_delete(local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ae7a;
    operator_delete(local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    BigNum a = BigNum("6");
    BigNum b = BigNum("2");
    BigNum c = BigNum("1234567827483828383893828238989938389893389");

   // a = BigNum("4096");
    b = BigNum("123456798960569059");
    c =  sqrt(b);
   // print(a);
    cout << " sqrt ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    // solve_system(vector<std::pair<BigNum, BigNum>> equations)

    vector<std::pair<BigNum, BigNum>> test = {{BigNum(2), BigNum(5)},
                                              {BigNum(3), BigNum(7)},
                                              {BigNum(5), BigNum(11)}};
    c = solve_system(test);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test4 = {{BigNum(5), BigNum(9)},
                                              {BigNum(7), BigNum(8)},
                                              {BigNum(3), BigNum(7)}};
    c = solve_system(test4);
    cout << "Result: ";
    print(c);
    cout << endl;
    vector<std::pair<BigNum, BigNum>> test1 = {{BigNum(1), BigNum(5)},
                                              {BigNum(2), BigNum(7)}};
    c = solve_system(test1);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test2 = {{BigNum(0), BigNum(2)},
                                               {BigNum(0), BigNum(4)}};
    c = solve_system(test2);
    cout << "Result: ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(13);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(7);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(71);
    b = BigNum(91);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;


    a = BigNum("12");
    b = BigNum("6");
    int f = 10;
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("3");
    b = BigNum("9");
    c = pow(a,b);
    print(a);
    cout << "^";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("400");
    b = BigNum("9");
    c = a + b;
    print(a);
    cout << " + ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    a = BigNum("64");
    b = BigNum("64");
    c = a * b;
    print(a);
    cout << " * ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("4096");
    b = BigNum("4");
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    return 0;
}